

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O2

string * __thiscall
helics::CoreApp::query_abi_cxx11_
          (string *__return_storage_ptr__,CoreApp *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  element_type *peVar1;
  allocator<char> local_31;
  string local_30;
  
  peVar1 = (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Core not available",&local_31);
    generateJsonErrorResponse((string *)__return_storage_ptr__,BAD_GATEWAY,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    (*peVar1->_vptr_Core[0x5e])
              (__return_storage_ptr__,peVar1,target._M_len,target._M_str,queryStr._M_len,
               queryStr._M_str,mode);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    CoreApp::query(std::string_view target, std::string_view queryStr, HelicsSequencingModes mode)
{
    return (core) ? core->query(target, queryStr, mode) :
                    generateJsonErrorResponse(JsonErrorCodes::BAD_GATEWAY, "Core not available");
}